

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O2

TestLog * tcu::operator<<(TestLog *log,exception *e)

{
  ostringstream *this;
  char *pcVar1;
  TestLog *pTVar2;
  MessageBuilder local_190;
  
  this = &local_190.m_str;
  local_190.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  pcVar1 = (char *)(**(code **)(*(long *)e + 0x10))(e);
  std::operator<<((ostream *)this,pcVar1);
  pTVar2 = MessageBuilder::operator<<(&local_190,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return pTVar2;
}

Assistant:

inline TestLog& operator<< (TestLog& log, const std::exception& e)
{
	// \todo [2012-10-18 pyry] Print type info?
	return log << TestLog::Message << e.what() << TestLog::EndMessage;
}